

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_targetvalue_0_with_asset_Test::
~CoinSelection_SelectCoins_KnapsackSolver_targetvalue_0_with_asset_Test
          (CoinSelection_SelectCoins_KnapsackSolver_targetvalue_0_with_asset_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_KnapsackSolver_targetvalue_0_with_asset_Test
            ((CoinSelection_SelectCoins_KnapsackSolver_targetvalue_0_with_asset_Test *)0x27f1d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_targetvalue_0_with_asset)
{
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(0.0);
  option.SetFeeAsset(exp_dummy_asset_a);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 0;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(0);
  std::map<std::string, bool> map_searched_bnb;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 0);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}